

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timing_registry::task_info::print(task_info *this)

{
  string local_a0;
  string local_80;
  string local_60;
  string local_30 [8];
  string msg;
  task_info *this_local;
  
  msg.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30,(string *)this);
  std::__cxx11::string::operator+=(local_30," took ");
  std::__cxx11::to_string(&local_60,this->duration_);
  std::__cxx11::string::operator+=(local_30,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::operator+=(local_30,"ms, it started on core ");
  std::__cxx11::to_string(&local_80,this->startedOnCore_);
  std::__cxx11::string::operator+=(local_30,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=(local_30,", and stopped on core ");
  std::__cxx11::to_string(&local_a0,this->stoppedOnCore_);
  std::__cxx11::string::operator+=(local_30,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::operator+=(local_30,"\n");
  std::operator<<((ostream *)&std::cout,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void print() const
        {
            std::string msg = name;
            msg += " took ";
            msg += std::to_string(duration_);
            msg += "ms, it started on core ";
            msg += std::to_string(startedOnCore_);
            msg += ", and stopped on core ";
            msg += std::to_string(stoppedOnCore_);
            msg += "\n";
            std::cout << msg;
        }